

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O3

idx_t __thiscall
duckdb::WindowTokenTree::PeerEnd(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  value_type vVar1;
  bool bVar2;
  undefined8 uVar3;
  type this_00;
  const_reference pvVar4;
  const_reference pvVar5;
  type this_01;
  const_reference pvVar6;
  const_reference pvVar7;
  unsigned_long uVar8;
  vector<unsigned_long,_true> *this_02;
  vector<unsigned_int,_true> *this_03;
  pointer puVar9;
  unsigned_long uVar10;
  pointer puVar11;
  size_type sVar12;
  ulong uVar13;
  ulong uVar14;
  size_type __n;
  uint uVar15;
  ulong uVar16;
  unsigned_long run_begin_1;
  idx_t iVar17;
  ulong uVar18;
  uint *puVar19;
  uint *puVar20;
  ulong *puVar21;
  ulong *puVar22;
  unsigned_long run_begin_3;
  idx_t iVar23;
  ulong uVar24;
  ulong uVar25;
  size_type sVar26;
  idx_t iVar27;
  ulong uVar28;
  ulong local_98;
  ulong local_90;
  size_type local_88;
  
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst32);
    pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this_01->tree,0);
    pvVar7 = vector<unsigned_int,_true>::operator[](&pvVar6->first,row_idx);
    if (lower < upper) {
      uVar15 = *pvVar7 + 1;
      iVar23 = lower;
      if (upper - 1 == lower) {
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,0);
        puVar9 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = lower;
      }
      else {
        local_90 = 1;
        sVar26 = 0;
        uVar16 = upper - 1;
        iVar27 = lower;
        do {
          uVar24 = uVar16;
          iVar27 = iVar27 >> 5;
          local_90 = local_90 * 0x20;
          sVar26 = sVar26 + 1;
          uVar16 = uVar24 >> 5;
        } while (iVar27 != uVar24 >> 5);
        iVar17 = local_90 * uVar24 >> 5;
        local_98 = iVar17;
        if (2 < sVar26) {
          uVar18 = iVar27 * local_90;
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,0);
          uVar16 = (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          if (uVar18 + local_90 <= uVar16) {
            uVar16 = uVar18 + local_90;
          }
          pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,sVar26);
          puVar9 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar20 = puVar9 + uVar18;
          uVar13 = uVar16 - uVar18;
          if (uVar13 != 0 && (long)uVar18 <= (long)uVar16) {
            do {
              uVar16 = uVar13 >> 1;
              uVar28 = ~uVar16 + uVar13;
              uVar13 = uVar16;
              if (puVar20[uVar16] < uVar15) {
                puVar20 = puVar20 + uVar16 + 1;
                uVar13 = uVar28;
              }
            } while (0 < (long)uVar13);
          }
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar20 - (long)puVar9 >> 2);
          uVar16 = (uVar18 / local_90) * 0x40 + (uVar8 & 0xffffffffffffffe0);
          local_88 = (uVar24 | 0xffffffffffffffe0) + uVar16;
          __n = (uint)uVar24 & 0x1f | uVar16;
          uVar16 = sVar26;
          do {
            sVar26 = uVar16 - 1;
            local_90 = local_90 >> 5;
            pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                     ::operator[](&this_01->tree,sVar26);
            puVar9 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                     ::operator[](&this_01->tree,uVar16);
            this_03 = &pvVar6->second;
            local_88 = local_88 + 0x1f;
            uVar24 = local_98 - lower;
            while (local_90 <= uVar24) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_88);
              uVar18 = (ulong)*pvVar7;
              puVar20 = puVar9 + uVar18;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_88 + 0x20);
              uVar24 = *pvVar7 - uVar18;
              if (uVar24 != 0 && uVar18 <= *pvVar7) {
                do {
                  uVar18 = uVar24 >> 1;
                  uVar13 = ~uVar18 + uVar24;
                  uVar24 = uVar18;
                  if (puVar20[uVar18] < uVar15) {
                    puVar20 = puVar20 + uVar18 + 1;
                    uVar24 = uVar13;
                  }
                } while (0 < (long)uVar24);
              }
              local_98 = local_98 - local_90;
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar20 - (long)puVar9 >> 2);
              iVar23 = iVar23 + (uVar8 - local_98);
              local_88 = local_88 - 1;
              uVar24 = local_98 - lower;
            }
            if (local_98 != lower) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_88);
              uVar18 = (ulong)*pvVar7;
              puVar20 = puVar9 + uVar18;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,local_88 + 0x20);
              uVar24 = *pvVar7 - uVar18;
              if (uVar24 != 0 && uVar18 <= *pvVar7) {
                do {
                  uVar18 = uVar24 >> 1;
                  uVar13 = ~uVar18 + uVar24;
                  uVar24 = uVar18;
                  if (puVar20[uVar18] < uVar15) {
                    puVar20 = puVar20 + uVar18 + 1;
                    uVar24 = uVar13;
                  }
                } while (0 < (long)uVar24);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar20 - (long)puVar9 >> 2);
              local_88 = (lower / local_90) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            for (; local_90 <= upper - iVar17; iVar17 = iVar17 + local_90) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,__n);
              uVar18 = (ulong)*pvVar7;
              puVar20 = puVar9 + uVar18;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,__n + 0x20);
              uVar24 = *pvVar7 - uVar18;
              if (uVar24 != 0 && uVar18 <= *pvVar7) {
                do {
                  uVar18 = uVar24 >> 1;
                  uVar13 = ~uVar18 + uVar24;
                  uVar24 = uVar18;
                  if (puVar20[uVar18] < uVar15) {
                    puVar20 = puVar20 + uVar18 + 1;
                    uVar24 = uVar13;
                  }
                } while (0 < (long)uVar24);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar20 - (long)puVar9 >> 2);
              iVar23 = iVar23 + (uVar8 - iVar17);
              __n = __n + 1;
            }
            if (iVar17 != upper) {
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,__n);
              uVar18 = (ulong)*pvVar7;
              puVar20 = puVar9 + uVar18;
              pvVar7 = vector<unsigned_int,_true>::operator[](this_03,__n + 0x20);
              uVar24 = *pvVar7 - uVar18;
              if (uVar24 != 0 && uVar18 <= *pvVar7) {
                do {
                  uVar18 = uVar24 >> 1;
                  uVar13 = ~uVar18 + uVar24;
                  uVar24 = uVar18;
                  if (puVar20[uVar18] < uVar15) {
                    puVar20 = puVar20 + uVar18 + 1;
                    uVar24 = uVar13;
                  }
                } while (0 < (long)uVar24);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar20 - (long)puVar9 >> 2);
              __n = (upper / local_90) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            bVar2 = 2 < uVar16;
            uVar16 = sVar26;
          } while (bVar2);
        }
        if (1 < sVar26) {
          sVar26 = sVar26 - 1;
          do {
            uVar24 = local_90 >> 5;
            pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                     ::operator[](&this_01->tree,sVar26);
            puVar9 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar16 = local_98 - lower;
            while (uVar24 <= uVar16) {
              puVar20 = puVar9 + (local_98 - uVar24);
              uVar16 = uVar24;
              puVar19 = puVar20;
              if (0x1f < local_90) {
                do {
                  uVar18 = uVar16 >> 1;
                  if (puVar19[uVar18] < uVar15) {
                    puVar19 = puVar19 + uVar18 + 1;
                    uVar18 = ~uVar18 + uVar16;
                  }
                  uVar16 = uVar18;
                } while (0 < (long)uVar18);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar19 - (long)puVar9 >> 2);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar20 - (long)puVar9 >> 2);
              iVar23 = iVar23 + (uVar8 - uVar10);
              local_98 = local_98 - uVar24;
              uVar16 = local_98 - lower;
            }
            for (; uVar24 <= upper - iVar17; iVar17 = iVar17 + uVar24) {
              puVar20 = puVar9 + iVar17;
              uVar16 = uVar24;
              do {
                uVar18 = uVar16 >> 1;
                uVar13 = ~uVar18 + uVar16;
                uVar16 = uVar18;
                if (puVar20[uVar18] < uVar15) {
                  puVar20 = puVar20 + uVar18 + 1;
                  uVar16 = uVar13;
                }
              } while (0 < (long)uVar16);
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar20 - (long)puVar9 >> 2);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar17);
              iVar23 = iVar23 + (uVar8 - uVar10);
            }
            sVar26 = sVar26 - 1;
            local_90 = uVar24;
          } while (sVar26 != 0);
        }
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this_01->tree,0);
        puVar9 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_98 != lower) {
          do {
            iVar23 = iVar23 + (puVar9[lower] < uVar15);
            lower = lower + 1;
          } while (local_98 != lower);
        }
      }
      for (; lower = iVar23, iVar17 != upper; iVar17 = iVar17 + 1) {
        uVar3 = iVar17 * 4;
        iVar23 = lower + (*(uint *)((long)puVar9 + uVar3) < uVar15);
      }
    }
  }
  else {
    this_00 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
              ::operator*(&(this->super_WindowMergeSortTree).mst64);
    pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::operator[](&this_00->tree,0);
    pvVar5 = vector<unsigned_long,_true>::operator[](&pvVar4->first,row_idx);
    if (lower < upper) {
      uVar16 = *pvVar5 + 1;
      iVar23 = lower;
      if (upper - 1 == lower) {
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,0);
        puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar17 = lower;
      }
      else {
        uVar18 = 1;
        sVar12 = 0;
        uVar24 = upper - 1;
        iVar27 = lower;
        do {
          uVar13 = uVar24;
          iVar27 = iVar27 >> 5;
          uVar18 = uVar18 * 0x20;
          sVar12 = sVar12 + 1;
          uVar24 = uVar13 >> 5;
        } while (iVar27 != uVar13 >> 5);
        iVar17 = uVar18 * uVar13 >> 5;
        local_98 = iVar17;
        if (2 < sVar12) {
          uVar28 = iVar27 * uVar18;
          pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,0);
          uVar24 = (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                         .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                         .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (uVar28 + uVar18 <= uVar24) {
            uVar24 = uVar28 + uVar18;
          }
          pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_00->tree,sVar12);
          puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar22 = puVar11 + uVar28;
          uVar25 = uVar24 - uVar28;
          if (uVar25 != 0 && (long)uVar28 <= (long)uVar24) {
            do {
              uVar24 = uVar25 >> 1;
              uVar14 = ~uVar24 + uVar25;
              uVar25 = uVar24;
              if (puVar22[uVar24] < uVar16) {
                puVar22 = puVar22 + uVar24 + 1;
                uVar25 = uVar14;
              }
            } while (0 < (long)uVar25);
          }
          uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((long)puVar22 - (long)puVar11 >> 3);
          uVar28 = (uVar28 / uVar18) * 0x40 + (uVar8 & 0xffffffffffffffe0);
          local_88 = (uVar13 | 0xffffffffffffffe0) + uVar28;
          uVar28 = (uint)uVar13 & 0x1f | uVar28;
          uVar24 = sVar12;
          do {
            sVar12 = uVar24 - 1;
            uVar18 = uVar18 >> 5;
            pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                     ::operator[](&this_00->tree,sVar12);
            puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                     ::operator[](&this_00->tree,uVar24);
            this_02 = &pvVar4->second;
            local_88 = local_88 + 0x1f;
            uVar13 = local_98 - lower;
            while (uVar18 <= uVar13) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88);
              vVar1 = *pvVar5;
              puVar22 = puVar11 + vVar1;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88 + 0x20);
              uVar13 = *pvVar5 - vVar1;
              if (uVar13 != 0 && (long)vVar1 <= (long)*pvVar5) {
                do {
                  uVar25 = uVar13 >> 1;
                  uVar14 = ~uVar25 + uVar13;
                  uVar13 = uVar25;
                  if (puVar22[uVar25] < uVar16) {
                    puVar22 = puVar22 + uVar25 + 1;
                    uVar13 = uVar14;
                  }
                } while (0 < (long)uVar13);
              }
              local_98 = local_98 - uVar18;
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar22 - (long)puVar11 >> 3);
              iVar23 = iVar23 + (uVar8 - local_98);
              local_88 = local_88 - 1;
              uVar13 = local_98 - lower;
            }
            if (local_98 != lower) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88);
              vVar1 = *pvVar5;
              puVar22 = puVar11 + vVar1;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,local_88 + 0x20);
              uVar13 = *pvVar5 - vVar1;
              if (uVar13 != 0 && (long)vVar1 <= (long)*pvVar5) {
                do {
                  uVar25 = uVar13 >> 1;
                  uVar14 = ~uVar25 + uVar13;
                  uVar13 = uVar25;
                  if (puVar22[uVar25] < uVar16) {
                    puVar22 = puVar22 + uVar25 + 1;
                    uVar13 = uVar14;
                  }
                } while (0 < (long)uVar13);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar22 - (long)puVar11 >> 3);
              local_88 = (lower / uVar18) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            for (; uVar18 <= upper - iVar17; iVar17 = iVar17 + uVar18) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,uVar28);
              vVar1 = *pvVar5;
              puVar22 = puVar11 + vVar1;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,uVar28 + 0x20);
              uVar13 = *pvVar5 - vVar1;
              if (uVar13 != 0 && (long)vVar1 <= (long)*pvVar5) {
                do {
                  uVar25 = uVar13 >> 1;
                  uVar14 = ~uVar25 + uVar13;
                  uVar13 = uVar25;
                  if (puVar22[uVar25] < uVar16) {
                    puVar22 = puVar22 + uVar25 + 1;
                    uVar13 = uVar14;
                  }
                } while (0 < (long)uVar13);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar22 - (long)puVar11 >> 3);
              iVar23 = iVar23 + (uVar8 - iVar17);
              uVar28 = uVar28 + 1;
            }
            if (iVar17 != upper) {
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,uVar28);
              vVar1 = *pvVar5;
              puVar22 = puVar11 + vVar1;
              pvVar5 = vector<unsigned_long,_true>::operator[](this_02,uVar28 + 0x20);
              uVar13 = *pvVar5 - vVar1;
              if (uVar13 != 0 && (long)vVar1 <= (long)*pvVar5) {
                do {
                  uVar28 = uVar13 >> 1;
                  uVar25 = ~uVar28 + uVar13;
                  uVar13 = uVar28;
                  if (puVar22[uVar28] < uVar16) {
                    puVar22 = puVar22 + uVar28 + 1;
                    uVar13 = uVar25;
                  }
                } while (0 < (long)uVar13);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar22 - (long)puVar11 >> 3);
              uVar28 = (upper / uVar18) * 0x40 + (uVar8 & 0xffffffffffffffe0);
            }
            bVar2 = 2 < uVar24;
            uVar24 = sVar12;
          } while (bVar2);
        }
        if (1 < sVar12) {
          sVar12 = sVar12 - 1;
          do {
            uVar13 = uVar18 >> 5;
            pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                     ::operator[](&this_00->tree,sVar12);
            puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar24 = local_98 - lower;
            while (uVar13 <= uVar24) {
              puVar22 = puVar11 + (local_98 - uVar13);
              uVar24 = uVar13;
              puVar21 = puVar22;
              if (0x1f < uVar18) {
                do {
                  uVar28 = uVar24 >> 1;
                  if (puVar21[uVar28] < uVar16) {
                    puVar21 = puVar21 + uVar28 + 1;
                    uVar28 = ~uVar28 + uVar24;
                  }
                  uVar24 = uVar28;
                } while (0 < (long)uVar28);
              }
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar21 - (long)puVar11 >> 3);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar22 - (long)puVar11 >> 3);
              iVar23 = iVar23 + (uVar8 - uVar10);
              local_98 = local_98 - uVar13;
              uVar24 = local_98 - lower;
            }
            for (; uVar13 <= upper - iVar17; iVar17 = iVar17 + uVar13) {
              puVar22 = puVar11 + iVar17;
              uVar24 = uVar13;
              do {
                uVar18 = uVar24 >> 1;
                uVar28 = ~uVar18 + uVar24;
                uVar24 = uVar18;
                if (puVar22[uVar18] < uVar16) {
                  puVar22 = puVar22 + uVar18 + 1;
                  uVar24 = uVar28;
                }
              } while (0 < (long)uVar24);
              uVar8 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                ((long)puVar22 - (long)puVar11 >> 3);
              uVar10 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar17);
              iVar23 = iVar23 + (uVar8 - uVar10);
            }
            sVar12 = sVar12 - 1;
            uVar18 = uVar13;
          } while (sVar12 != 0);
        }
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::operator[](&this_00->tree,0);
        puVar11 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_98 != lower) {
          do {
            iVar23 = iVar23 + (puVar11[lower] < uVar16);
            lower = lower + 1;
          } while (local_98 != lower);
        }
      }
      for (; lower = iVar23, iVar17 != upper; iVar17 = iVar17 + 1) {
        puVar22 = puVar11 + iVar17;
        iVar23 = lower + (*puVar22 < uVar16);
      }
    }
  }
  return lower;
}

Assistant:

idx_t WindowTokenTree::PeerEnd(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return NextPeer(*mst64, lower, upper, row_idx);
	} else {
		return NextPeer(*mst32, lower, upper, row_idx);
	}
}